

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O0

void __thiscall
jbcoin::STPathElement::STPathElement
          (STPathElement *this,AccountID *account,Currency *currency,AccountID *issuer,
          bool forceCurrency)

{
  bool bVar1;
  size_t sVar2;
  bool forceCurrency_local;
  AccountID *issuer_local;
  Currency *currency_local;
  AccountID *account_local;
  STPathElement *this_local;
  
  this->mType = 0;
  *(undefined8 *)(this->mAccountID).pn = *(undefined8 *)account->pn;
  *(undefined8 *)((this->mAccountID).pn + 2) = *(undefined8 *)(account->pn + 2);
  (this->mAccountID).pn[4] = account->pn[4];
  *(undefined8 *)(this->mCurrencyID).pn = *(undefined8 *)currency->pn;
  *(undefined8 *)((this->mCurrencyID).pn + 2) = *(undefined8 *)(currency->pn + 2);
  (this->mCurrencyID).pn[4] = currency->pn[4];
  *(undefined8 *)(this->mIssuerID).pn = *(undefined8 *)issuer->pn;
  *(undefined8 *)((this->mIssuerID).pn + 2) = *(undefined8 *)(issuer->pn + 2);
  (this->mIssuerID).pn[4] = issuer->pn[4];
  bVar1 = isXRP(&this->mAccountID);
  this->is_offer_ = bVar1;
  if ((this->is_offer_ & 1U) == 0) {
    this->mType = this->mType | 1;
  }
  if (!forceCurrency) {
    bVar1 = isXRP(currency);
    if (bVar1) goto LAB_00369d3d;
  }
  this->mType = this->mType | 0x10;
LAB_00369d3d:
  bVar1 = isXRP(issuer);
  if (!bVar1) {
    this->mType = this->mType | 0x20;
  }
  sVar2 = get_hash(this);
  this->hash_value_ = sVar2;
  return;
}

Assistant:

STPathElement (
        AccountID const& account, Currency const& currency,
        AccountID const& issuer, bool forceCurrency = false)
        : mType (typeNone), mAccountID (account), mCurrencyID (currency)
        , mIssuerID (issuer), is_offer_ (isXRP(mAccountID))
    {
        if (!is_offer_)
            mType |= typeAccount;

        if (forceCurrency || !isXRP(currency))
            mType |= typeCurrency;

        if (!isXRP(issuer))
            mType |= typeIssuer;

        hash_value_ = get_hash (*this);
    }